

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode Curl_url_set_authority(CURLU *u,char *authority,uint flags)

{
  size_t authlen;
  char *pcVar1;
  undefined1 local_40 [8];
  dynbuf host;
  CURLUcode result;
  uint flags_local;
  char *authority_local;
  CURLU *u_local;
  
  host.toobig._4_4_ = flags;
  Curl_dyn_init((dynbuf *)local_40,8000000);
  authlen = strlen(authority);
  host.toobig._0_4_ =
       parse_authority(u,authority,authlen,host.toobig._4_4_,(dynbuf *)local_40,
                       u->scheme != (char *)0x0);
  if ((CURLUcode)host.toobig == CURLUE_OK) {
    (*Curl_cfree)(u->host);
    pcVar1 = Curl_dyn_ptr((dynbuf *)local_40);
    u->host = pcVar1;
  }
  else {
    Curl_dyn_free((dynbuf *)local_40);
  }
  return (CURLUcode)host.toobig;
}

Assistant:

CURLUcode Curl_url_set_authority(CURLU *u, const char *authority,
                                 unsigned int flags)
{
  CURLUcode result;
  struct dynbuf host;

  DEBUGASSERT(authority);
  Curl_dyn_init(&host, CURL_MAX_INPUT_LENGTH);

  result = parse_authority(u, authority, strlen(authority), flags,
                           &host, !!u->scheme);
  if(result)
    Curl_dyn_free(&host);
  else {
    free(u->host);
    u->host = Curl_dyn_ptr(&host);
  }
  return result;
}